

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_helpers.h
# Opt level: O0

pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
* winmd::reader::get_type_namespace_and_name
            (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
             *__return_storage_ptr__,coded_index<winmd::reader::TypeDefOrRef> *type)

{
  TypeDefOrRef TVar1;
  TypeDef TVar2;
  TypeRef TVar3;
  string_view local_90;
  string_view local_80;
  table_base *local_70;
  uint32_t local_68;
  undefined1 local_60 [8];
  TypeRef ref;
  string_view local_40;
  table_base *local_30;
  uint32_t local_28;
  undefined1 local_20 [8];
  TypeDef def;
  coded_index<winmd::reader::TypeDefOrRef> *type_local;
  
  def.super_row_base<winmd::reader::TypeDef>._8_8_ = type;
  TVar1 = index_base<winmd::reader::TypeDefOrRef>::type
                    ((index_base<winmd::reader::TypeDefOrRef> *)type);
  if (TVar1 == TypeDef) {
    TVar2 = typed_index<winmd::reader::TypeDefOrRef>::TypeDef
                      ((typed_index<winmd::reader::TypeDefOrRef> *)
                       def.super_row_base<winmd::reader::TypeDef>._8_8_);
    local_30 = TVar2.super_row_base<winmd::reader::TypeDef>.m_table;
    local_28 = TVar2.super_row_base<winmd::reader::TypeDef>.m_index;
    local_20 = (undefined1  [8])local_30;
    def.super_row_base<winmd::reader::TypeDef>.m_table._0_4_ = local_28;
    local_40 = TypeDef::TypeNamespace((TypeDef *)local_20);
    join_0x00000010_0x00000000_ = TypeDef::TypeName((TypeDef *)local_20);
    cppwinrt::std::
    pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::
    pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_true>
              (__return_storage_ptr__,&local_40,
               (basic_string_view<char,_std::char_traits<char>_> *)
               &ref.super_row_base<winmd::reader::TypeRef>.m_index);
  }
  else {
    TVar1 = index_base<winmd::reader::TypeDefOrRef>::type
                      ((index_base<winmd::reader::TypeDefOrRef> *)
                       def.super_row_base<winmd::reader::TypeDef>._8_8_);
    if (TVar1 == TypeRef) {
      TVar3 = typed_index<winmd::reader::TypeDefOrRef>::TypeRef
                        ((typed_index<winmd::reader::TypeDefOrRef> *)
                         def.super_row_base<winmd::reader::TypeDef>._8_8_);
      local_70 = TVar3.super_row_base<winmd::reader::TypeRef>.m_table;
      local_68 = TVar3.super_row_base<winmd::reader::TypeRef>.m_index;
      local_60 = (undefined1  [8])local_70;
      ref.super_row_base<winmd::reader::TypeRef>.m_table._0_4_ = local_68;
      local_80 = TypeRef::TypeNamespace((TypeRef *)local_60);
      local_90 = TypeRef::TypeName((TypeRef *)local_60);
      cppwinrt::std::
      pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
      ::
      pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_true>
                (__return_storage_ptr__,&local_80,&local_90);
    }
    else {
      cppwinrt::std::
      pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
      ::
      pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_true>
                (__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<std::string_view, std::string_view> get_type_namespace_and_name(coded_index<TypeDefOrRef> const& type)
    {
        if (type.type() == TypeDefOrRef::TypeDef)
        {
            auto const def = type.TypeDef();
            return { def.TypeNamespace(), def.TypeName() };
        }
        else if (type.type() == TypeDefOrRef::TypeRef)
        {
            auto const ref = type.TypeRef();
            return { ref.TypeNamespace(), ref.TypeName() };
        }
        else
        {
            XLANG_ASSERT(false);
            return {};
        }
    }